

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O2

void presolve::dev_kkt_check::checkDualFeasibility(State *state,KktConditionDetails *details)

{
  double *pdVar1;
  double dVar2;
  pointer pdVar3;
  ostream *poVar4;
  char *pcVar5;
  int i;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  details->type = kPrimalFeasibility;
  details->max_violation = 0.0;
  details->sum_violation_2 = 0.0;
  details->checked = 0;
  details->violated = 0;
  for (lVar7 = 0; iVar6 = (int)lVar7, lVar7 < state->numCol; lVar7 = lVar7 + 1) {
    if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar7] != 0) {
      details->checked = details->checked + 1;
      dVar9 = (state->colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      pdVar3 = (state->colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((-INFINITY < dVar9) || (pdVar3[lVar7] < INFINITY)) {
        dVar8 = (state->colValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        dVar2 = pdVar3[lVar7];
        if ((dVar8 != dVar9) || (dVar2 <= dVar9)) {
          if (((dVar8 == dVar2) && (dVar9 < dVar2)) &&
             (1e-07 < (state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar7])) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: x[");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
            std::operator<<(poVar4,"]=");
            poVar4 = std::ostream::_M_insert<double>
                               ((state->colValue->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar7]);
            poVar4 = std::operator<<(poVar4,"=u[");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
            pcVar5 = "], z[";
            goto LAB_00352058;
          }
        }
        else {
          dVar9 = (state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
          if ((dVar9 < 0.0) && (1e-07 < ABS(dVar9))) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: l[");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
            std::operator<<(poVar4,"]=");
            poVar4 = std::ostream::_M_insert<double>
                               ((state->colLower->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar7]);
            poVar4 = std::operator<<(poVar4," = x[");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
            std::operator<<(poVar4,"]=");
            poVar4 = std::ostream::_M_insert<double>
                               ((state->colValue->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar7]);
            pcVar5 = ", z[";
LAB_00352058:
            poVar4 = std::operator<<(poVar4,pcVar5);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
            std::operator<<(poVar4,"]=");
            poVar4 = std::ostream::_M_insert<double>
                               ((state->colDual->super__Vector_base<double,_std::allocator<double>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar7]);
            std::endl<char,std::char_traits<char>>(poVar4);
            dVar9 = (state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar7];
            if (dVar9 != 0.0) {
              details->violated = details->violated + 1;
              dVar8 = ABS(dVar9);
              details->sum_violation_2 = dVar9 * dVar9 + details->sum_violation_2;
              if (details->max_violation <= dVar8 && dVar8 != details->max_violation) {
                details->max_violation = dVar8;
              }
            }
          }
        }
      }
      else if (1e-07 < ABS((state->colDual->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start[lVar7])) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: l=-inf, x[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
        std::operator<<(poVar4,"]=");
        poVar4 = std::ostream::_M_insert<double>
                           ((state->colValue->super__Vector_base<double,_std::allocator<double>_>).
                            _M_impl.super__Vector_impl_data._M_start[lVar7]);
        pcVar5 = ", u=inf, z[";
        goto LAB_00352058;
      }
    }
  }
  lVar7 = 0;
  do {
    if (state->numRow <= lVar7) {
      pcVar5 = "KKT check error: Dual feasibility fail.\n";
      if (details->violated == 0) {
        pcVar5 = "Dual feasible.\n";
      }
      std::operator<<((ostream *)&std::cout,pcVar5);
      return;
    }
    if ((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar7] != 0) {
      details->checked = details->checked + 1;
      dVar9 = (state->rowValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      dVar8 = (state->rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      iVar6 = (int)lVar7;
      if (1e-07 <= ABS(dVar8 - dVar9)) {
LAB_0035227f:
        if ((dVar9 <= dVar8) ||
           (1e-07 <= ABS(dVar9 - (state->rowUpper->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start[lVar7]))) {
          if ((dVar8 < dVar9 + 1e-07) &&
             ((dVar9 < (state->rowUpper->super__Vector_base<double,_std::allocator<double>_>).
                       _M_impl.super__Vector_impl_data._M_start[lVar7] + 1e-07 &&
              (1e-07 < ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start[lVar7]))))) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
            std::operator<<(poVar4,": L= ");
            poVar4 = std::ostream::_M_insert<double>
                               ((state->rowLower->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar7]);
            std::operator<<(poVar4,", Ax=");
            poVar4 = std::ostream::_M_insert<double>(dVar9);
            std::operator<<(poVar4,", U=");
            poVar4 = std::ostream::_M_insert<double>
                               ((state->rowUpper->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar7]);
            std::operator<<(poVar4,", y=");
            poVar4 = std::ostream::_M_insert<double>
                               ((state->rowDual->super__Vector_base<double,_std::allocator<double>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar7]);
            std::endl<char,std::char_traits<char>>(poVar4);
            dVar9 = ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start[lVar7]);
            goto LAB_0035249e;
          }
        }
        else if (1e-07 < (state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_start[lVar7]) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
          std::operator<<(poVar4,": L= ");
          poVar4 = std::ostream::_M_insert<double>
                             ((state->rowLower->super__Vector_base<double,_std::allocator<double>_>)
                              ._M_impl.super__Vector_impl_data._M_start[lVar7]);
          std::operator<<(poVar4,", Ax=");
          poVar4 = std::ostream::_M_insert<double>(dVar9);
          std::operator<<(poVar4,", U=");
          poVar4 = std::ostream::_M_insert<double>
                             ((state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)
                              ._M_impl.super__Vector_impl_data._M_start[lVar7]);
          std::operator<<(poVar4,", y=");
          poVar4 = std::ostream::_M_insert<double>
                             ((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start[lVar7]);
          std::endl<char,std::char_traits<char>>(poVar4);
          dVar9 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
LAB_0035249e:
          if (0.0 < dVar9) {
            details->violated = details->violated + 1;
            details->sum_violation_2 = dVar9 * dVar9 + details->sum_violation_2;
            if (details->max_violation <= dVar9 && dVar9 != details->max_violation) {
              details->max_violation = dVar9;
            }
          }
        }
      }
      else {
        dVar2 = (state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        if (1e-07 <= ABS(dVar2 - dVar9)) {
          if (dVar2 <= dVar9) goto LAB_0035227f;
          pdVar1 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar7;
          if (-1e-07 < *pdVar1 || *pdVar1 == -1e-07) goto LAB_003524d5;
          poVar4 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
          std::operator<<(poVar4,": L= ");
          poVar4 = std::ostream::_M_insert<double>
                             ((state->rowLower->super__Vector_base<double,_std::allocator<double>_>)
                              ._M_impl.super__Vector_impl_data._M_start[lVar7]);
          std::operator<<(poVar4,", Ax=");
          poVar4 = std::ostream::_M_insert<double>(dVar9);
          std::operator<<(poVar4,", U=");
          poVar4 = std::ostream::_M_insert<double>
                             ((state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)
                              ._M_impl.super__Vector_impl_data._M_start[lVar7]);
          std::operator<<(poVar4,", y=");
          poVar4 = std::ostream::_M_insert<double>
                             ((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start[lVar7]);
          std::endl<char,std::char_traits<char>>(poVar4);
          dVar9 = -(state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar7];
          goto LAB_0035249e;
        }
      }
    }
LAB_003524d5:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void checkDualFeasibility(const State& state, KktConditionDetails& details) {
  details.type = KktCondition::kPrimalFeasibility;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  // check values of z_j are dual feasible
  for (int i = 0; i < state.numCol; i++) {
    if (state.flagCol[i]) {
      details.checked++;
      double infeas = 0;
      // j not in L or U
      if (state.colLower[i] <= -kHighsInf && state.colUpper[i] >= kHighsInf) {
        if (fabs(state.colDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: l=-inf, x[" << i
                      << "]=" << state.colValue[i] << ", u=inf, z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }
      // j in L: x=l and l<u
      else if (state.colValue[i] == state.colLower[i] &&
               state.colLower[i] < state.colUpper[i]) {
        if (state.colDual[i] < 0 && fabs(state.colDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: l[" << i
                      << "]=" << state.colLower[i] << " = x[" << i
                      << "]=" << state.colValue[i] << ", z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }
      // j in U: x=u and l<u
      else if (state.colValue[i] == state.colUpper[i] &&
               state.colLower[i] < state.colUpper[i]) {
        if (state.colDual[i] > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: x[" << i
                      << "]=" << state.colValue[i] << "=u[" << i << "], z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  // check values of y_i are dual feasible
  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;

      double rowV = state.rowValue[i];

      // L = Ax = U can be any sign
      if (fabs(state.rowLower[i] - rowV) < tol &&
          fabs(state.rowUpper[i] - rowV) < tol)
        continue;

      double infeas = 0;
      // L = Ax < U
      if (fabs(state.rowLower[i] - rowV) < tol && rowV < state.rowUpper[i]) {
        if (state.rowDual[i] < -tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = -state.rowDual[i];
        }
      }
      // L < Ax = U
      else if (state.rowLower[i] < rowV &&
               fabs(rowV - state.rowUpper[i]) < tol) {
        if (state.rowDual[i] > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = state.rowDual[i];
        }
      }
      // L < Ax < U
      else if ((state.rowLower[i] < (rowV + tol)) &&
               (rowV < (state.rowUpper[i] + tol))) {
        if (fabs(state.rowDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = std::abs(state.rowDual[i]);
        }
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Dual feasible.\n";
  } else {
    if (dev_print == 1)
      std::cout << "KKT check error: Dual feasibility fail.\n";
  }
}